

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::solveUright(CLUFactor<double> *this,double *wrk,double *vec)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  long lVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar5;
  int j;
  double x;
  int c;
  int r;
  int i;
  undefined4 local_34;
  undefined4 local_1c;
  
  local_1c = *(int *)(in_RDI + 4);
  while (local_1c = local_1c + -1, -1 < local_1c) {
    iVar1 = *(int *)(*(long *)(in_RDI + 0x38) + (long)local_1c * 4);
    iVar2 = *(int *)(*(long *)(in_RDI + 0x48) + (long)local_1c * 4);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe0),(long)iVar1);
    dVar5 = *pvVar3 * *(double *)(in_RDX + (long)iVar1 * 8);
    *(double *)(in_RSI + (long)iVar2 * 8) = dVar5;
    *(undefined8 *)(in_RDX + (long)iVar1 * 8) = 0;
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      for (local_34 = *(int *)(*(long *)(in_RDI + 0x1a0) + (long)iVar2 * 4);
          local_34 <
          *(int *)(*(long *)(in_RDI + 0x1a0) + (long)iVar2 * 4) +
          *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar2 * 4); local_34 = local_34 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x188),
                            (long)local_34);
        lVar4 = (long)*(int *)(*(long *)(in_RDI + 0x180) + (long)local_34 * 4);
        *(double *)(in_RDX + lVar4 * 8) = *(double *)(in_RDX + lVar4 * 8) - dVar5 * *pvVar3;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUright(R* wrk, R* vec) const
{

   for(int i = thedim - 1; i >= 0; i--)
   {
      int  r = row.orig[i];
      int  c = col.orig[i];
      R x = wrk[c] = diag[r] * vec[r];

      vec[r] = 0.0;

      if(x != 0.0)
         //if (isNotZero(x))
      {
         for(int j = u.col.start[c]; j < u.col.start[c] + u.col.len[c]; j++)
            vec[u.col.idx[j]] -= x * u.col.val[j];
      }
   }
}